

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 UINT64_Marshal(UINT64 *source,BYTE **buffer,INT32 *size)

{
  int iVar1;
  
  if ((buffer != (BYTE **)0x0) &&
     ((size == (INT32 *)0x0 || (iVar1 = *size, *size = iVar1 + -8, 7 < iVar1)))) {
    Uint64ToByteArray(*source,*buffer);
    *buffer = *buffer + 8;
  }
  return 8;
}

Assistant:

UINT16
UINT64_Marshal(UINT64 *source, BYTE **buffer, INT32 *size)
{
    if (buffer != 0)
    {
        if ((size == 0) || ((*size -= 8) >= 0))
        {
            UINT64_TO_BYTE_ARRAY(*source, *buffer);
            *buffer += 8;
        }
        //pAssert(size == 0 || (*size >= 0));
    }
    return (8);
}